

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::ConsoleReporter::assertionEnded(ConsoleReporter *this,AssertionStats *_assertionStats)

{
  bool bVar1;
  int iVar2;
  AssertionPrinter printer;
  AssertionPrinter local_b0;
  
  iVar2 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[7])();
  if (((char)iVar2 != '\0') ||
     ((bVar1 = false,
      ((_assertionStats->assertionResult).m_resultData.resultType & FailureBit) != Ok &&
      (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) == Normal)))) {
    lazyPrint(this);
    AssertionPrinter::AssertionPrinter
              (&local_b0,(this->super_StreamingReporterBase).stream,_assertionStats);
    AssertionPrinter::print(&local_b0);
    std::endl<char,std::char_traits<char>>((this->super_StreamingReporterBase).stream);
    AssertionPrinter::~AssertionPrinter(&local_b0);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

virtual bool assertionEnded( AssertionStats const& _assertionStats ) {
            AssertionResult const& result = _assertionStats.assertionResult;

            // Drop out if result was successful and we're not printing those
            if( !m_config->includeSuccessfulResults() && result.isOk() )
                return false;

            lazyPrint();

            AssertionPrinter printer( stream, _assertionStats );
            printer.print();
            stream << std::endl;
            return true;
        }